

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_parse_result * __thiscall
pugi::xml_document::load
          (xml_parse_result *__return_storage_ptr__,xml_document *this,
          basic_istream<wchar_t,_std::char_traits<wchar_t>_> *stream,uint options)

{
  size_t *psVar1;
  uint uVar2;
  xml_encoding encoding;
  long lVar3;
  long lVar4;
  xml_stream_chunk<wchar_t> *pxVar5;
  ulong uVar6;
  ulong uVar7;
  xml_stream_chunk<wchar_t> *pxVar8;
  void *result;
  ulong size;
  xml_parse_status xVar9;
  xml_stream_chunk<wchar_t> *pxVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  auto_deleter<pugi::impl::(anonymous_namespace)::xml_stream_chunk<wchar_t>_> local_58;
  xml_document_struct *local_48;
  xml_document *local_40;
  xml_parse_result *local_38;
  
  reset(this);
  if (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 5) != 0) {
    xml_parse_result::xml_parse_result(__return_storage_ptr__);
    __return_storage_ptr__->status = status_io_error;
    goto LAB_0068d674;
  }
  local_48 = (xml_document_struct *)(this->super_xml_node)._root;
  local_40 = this;
  lVar3 = std::wistream::tellg();
  if (lVar3 < 0) {
    local_38 = __return_storage_ptr__;
    std::wios::clear((int)*(undefined8 *)(*(long *)stream + -0x18) + (int)stream);
    local_58.deleter = impl::anon_unknown_0::xml_stream_chunk<wchar_t>::destroy;
    uVar2 = *(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20);
    pxVar8 = (xml_stream_chunk<wchar_t> *)0x0;
    size = 0;
    pxVar10 = (xml_stream_chunk<wchar_t> *)0x0;
    do {
      local_58.data = pxVar10;
      if ((uVar2 & 2) != 0) {
        pxVar5 = (xml_stream_chunk<wchar_t> *)
                 (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>
                           ::allocate)(size + 1);
        pxVar8 = pxVar5;
        if (pxVar5 != (xml_stream_chunk<wchar_t> *)0x0) goto LAB_0068d5f4;
        xVar9 = status_out_of_memory;
        goto LAB_0068d620;
      }
      pxVar5 = (xml_stream_chunk<wchar_t> *)
               (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::
                         allocate)(0x7fe8);
      if (pxVar5 == (xml_stream_chunk<wchar_t> *)0x0) break;
      pxVar5->next = (xml_stream_chunk<wchar_t> *)0x0;
      pxVar5->size = 0;
      local_58.data = pxVar5;
      if (pxVar8 != (xml_stream_chunk<wchar_t> *)0x0) {
        pxVar8->next = pxVar5;
        local_58.data = pxVar10;
      }
      std::wistream::read((wchar_t *)stream,(long)pxVar5->data);
      uVar6 = *(long *)(stream + 8) * 4;
      pxVar5->size = uVar6;
      uVar2 = *(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20);
      if (((uVar2 & 1) != 0) || ((uVar2 & 6) == 4)) {
        xVar9 = status_io_error;
        goto LAB_0068d620;
      }
      uVar7 = uVar6 + size;
      if (uVar6 + size <= size) {
        uVar7 = size;
      }
      bVar11 = CARRY8(uVar6,size);
      pxVar8 = pxVar5;
      size = uVar7;
      pxVar10 = local_58.data;
    } while (!bVar11);
    xVar9 = status_out_of_memory;
LAB_0068d620:
    size = 0;
    pxVar5 = (xml_stream_chunk<wchar_t> *)0x0;
    goto LAB_0068d625;
  }
  auVar12 = std::wistream::tellg();
  lVar3 = auVar12._0_8_;
  xVar9 = status_io_error;
  std::wistream::seekg((long)stream,_S_beg);
  lVar4 = std::wistream::tellg();
  std::wistream::seekg(stream,lVar3,auVar12._8_8_);
  if (-1 < lVar3 && ((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 5) == 0) {
    if (-1 < lVar4 - lVar3) {
      pxVar5 = (xml_stream_chunk<wchar_t> *)
               (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::
                         allocate)((lVar4 - lVar3) * 4 + 1);
      local_58.deleter =
           (D)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate;
      local_58.data = pxVar5;
      if (pxVar5 == (xml_stream_chunk<wchar_t> *)0x0) {
        xVar9 = status_out_of_memory;
LAB_0068d638:
        size = 0;
        pxVar5 = (xml_stream_chunk<wchar_t> *)0x0;
      }
      else {
        std::wistream::read((wchar_t *)stream,(long)pxVar5);
        if ((*(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) & 6) == 4 ||
            (*(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) & 1) != 0) {
          xVar9 = status_io_error;
          goto LAB_0068d638;
        }
        local_58.data = (xml_stream_chunk<wchar_t> *)0x0;
        size = *(long *)(stream + 8) << 2;
        xVar9 = status_ok;
      }
      impl::anon_unknown_0::auto_deleter<void>::~auto_deleter((auto_deleter<void> *)&local_58);
      goto LAB_0068d661;
    }
    xVar9 = status_out_of_memory;
  }
  goto LAB_0068d669;
LAB_0068d5f4:
  for (; pxVar10 != (xml_stream_chunk<wchar_t> *)0x0; pxVar10 = pxVar10->next) {
    memcpy(pxVar8,pxVar10->data,pxVar10->size);
    psVar1 = &pxVar10->size;
    pxVar8 = (xml_stream_chunk<wchar_t> *)((long)pxVar8->data + (*psVar1 - 0x10));
  }
  xVar9 = status_ok;
LAB_0068d625:
  impl::anon_unknown_0::auto_deleter<pugi::impl::(anonymous_namespace)::xml_stream_chunk<wchar_t>_>
  ::~auto_deleter(&local_58);
  __return_storage_ptr__ = local_38;
LAB_0068d661:
  if (xVar9 == status_ok) {
    local_40 = (xml_document *)&local_40->_buffer;
    encoding = impl::anon_unknown_0::get_buffer_encoding(encoding_wchar,pxVar5,size);
    if (encoding == encoding_utf8) {
      *(undefined1 *)((long)pxVar5->data + (size - 0x10)) = 0;
      size = size + 1;
    }
    impl::anon_unknown_0::load_buffer_impl
              (__return_storage_ptr__,local_48,&local_48->super_xml_node_struct,pxVar5,size,options,
               encoding,true,true,(char_t **)local_40);
    return __return_storage_ptr__;
  }
LAB_0068d669:
  xml_parse_result::xml_parse_result(__return_storage_ptr__);
  __return_storage_ptr__->status = xVar9;
LAB_0068d674:
  __return_storage_ptr__->offset = 0;
  return __return_storage_ptr__;
}

Assistant:

PUGI_IMPL_FN xml_parse_result xml_document::load(std::basic_istream<wchar_t>& stream, unsigned int options)
	{
		reset();

		return impl::load_stream_impl(static_cast<impl::xml_document_struct*>(_root), stream, options, encoding_wchar, &_buffer);
	}